

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableAllTest_LoadFactor_Test<google::HashtableInterface_DenseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_LoadFactor_Test<google::HashtableInterface_DenseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  size_type sVar1;
  char *pcVar2;
  int i;
  int iVar3;
  float grow;
  float fVar4;
  AssertionResult gtest_ar;
  size_t bucket_count;
  float shrink_threshold;
  TypeParam ht;
  AssertHelper local_150;
  key_type local_148;
  float local_124;
  string local_120;
  long *local_100;
  int local_f8;
  float local_f4;
  undefined1 local_f0 [136];
  size_type local_68;
  size_type local_60;
  long *local_58;
  
  local_124 = 0.2;
  this_00 = (dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
             *)(local_f0 + 8);
  do {
    local_120._M_dataplus._M_p = (pointer)0x0;
    local_120._M_string_length._0_4_ = 0;
    local_100 = (long *)0x0;
    local_f8 = 0;
    local_148._M_dataplus._M_p._0_4_ = 0;
    local_148._M_string_length = 0;
    google::
    HashtableInterface_DenseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_DenseHashtable
              ((HashtableInterface_DenseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
                *)local_f0,0,(hasher *)&local_120,(key_equal *)&local_100,
               (allocator_type *)&local_148);
    HashtableTest<google::HashtableInterface_DenseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueKey(&local_148,
                (HashtableTest<google::HashtableInterface_DenseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                 *)this,1);
    google::
    dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
    ::squash_deleted(this_00);
    local_f0[0x32] = true;
    std::__cxx11::string::_M_assign((string *)(local_f0 + 0x48));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_148._M_dataplus._M_p._4_4_,local_148._M_dataplus._M_p._0_4_) !=
        &local_148.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_148._M_dataplus._M_p._4_4_,local_148._M_dataplus._M_p._0_4_));
    }
    local_f0._44_4_ = local_124 * 0.5;
    local_f0._40_4_ = local_124;
    fVar4 = local_124 * (float)local_58;
    local_f0._24_8_ = (undefined8)fVar4;
    local_f0._24_8_ = (long)(fVar4 - 9.223372e+18) & (long)local_f0._24_8_ >> 0x3f | local_f0._24_8_
    ;
    local_f0[0x30] = false;
    if (0.0 <= (float)local_f0._44_4_) {
      local_f0._44_4_ = 0.0;
    }
    fVar4 = (float)local_f0._44_4_ * (float)local_58;
    local_f0._32_8_ = (undefined8)fVar4;
    local_f0._32_8_ = (long)(fVar4 - 9.223372e+18) & (long)local_f0._32_8_ >> 0x3f | local_f0._32_8_
    ;
    local_120._M_dataplus._M_p._0_4_ = local_124;
    testing::internal::CmpHelperEQ<float,float>
              ((internal *)&local_148,"grow_threshold","ht.max_load_factor()",&local_124,
               (float *)&local_120);
    if ((char)local_148._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_120);
      pcVar2 = "";
      if ((undefined8 *)local_148._M_string_length != (undefined8 *)0x0) {
        pcVar2 = *(char **)local_148._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_100,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x269,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)&local_120);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
      if ((long *)local_120._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_120._M_dataplus._M_p + 8))();
      }
    }
    sVar1 = local_148._M_string_length;
    if ((undefined8 *)local_148._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_148._M_string_length !=
          (undefined8 *)(local_148._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_148._M_string_length);
      }
      operator_delete((void *)sVar1);
    }
    local_120._M_dataplus._M_p = (pointer)0x0;
    local_100 = (long *)CONCAT44(local_100._4_4_,local_f0._44_4_);
    testing::internal::CmpHelperEQ<double,float>
              ((internal *)&local_148,"0.0","ht.min_load_factor()",(double *)&local_120,
               (float *)&local_100);
    if ((char)local_148._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_120);
      pcVar2 = "";
      if ((undefined8 *)local_148._M_string_length != (undefined8 *)0x0) {
        pcVar2 = *(char **)local_148._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_100,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x26a,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)&local_120);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
      if ((long *)local_120._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_120._M_dataplus._M_p + 8))();
      }
    }
    sVar1 = local_148._M_string_length;
    if ((undefined8 *)local_148._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_148._M_string_length !=
          (undefined8 *)(local_148._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_148._M_string_length);
      }
      operator_delete((void *)sVar1);
    }
    google::
    dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
    ::resize(this_00,0x4098);
    local_100 = local_58;
    UniqueObjectHelper<std::__cxx11::string>(&local_120,2);
    google::
    dense_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,Capital,SetKey<std::__cxx11::string,Capital>,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>
    ::insert<std::__cxx11::string_const&>
              ((pair<google::dense_hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>,_bool>
                *)&local_148,
               (dense_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,Capital,SetKey<std::__cxx11::string,Capital>,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>
                *)this_00,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    HashtableTest<google::HashtableInterface_DenseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueKey(&local_148,
                (HashtableTest<google::HashtableInterface_DenseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                 *)this,2);
    google::
    dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
    ::erase(this_00,&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_148._M_dataplus._M_p._4_4_,local_148._M_dataplus._M_p._0_4_) !=
        &local_148.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_148._M_dataplus._M_p._4_4_,local_148._M_dataplus._M_p._0_4_));
    }
    iVar3 = 2;
    while( true ) {
      UniqueObjectHelper<std::__cxx11::string>(&local_120,iVar3);
      google::
      dense_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,Capital,SetKey<std::__cxx11::string,Capital>,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>
      ::insert<std::__cxx11::string_const&>
                ((pair<google::dense_hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>,_bool>
                  *)&local_148,
                 (dense_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,Capital,SetKey<std::__cxx11::string,Capital>,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>
                  *)this_00,&local_120);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p);
      }
      if (local_124 <= (float)(local_60 - local_68) / (float)local_100) break;
      local_120._M_dataplus._M_p = (pointer)local_58;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&local_148,"bucket_count","ht.bucket_count()",
                 (unsigned_long *)&local_100,(unsigned_long *)&local_120);
      if ((char)local_148._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_120);
        pcVar2 = "";
        if ((undefined8 *)local_148._M_string_length != (undefined8 *)0x0) {
          pcVar2 = *(char **)local_148._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_150,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                   ,0x275,pcVar2);
        testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_120);
        testing::internal::AssertHelper::~AssertHelper(&local_150);
        if ((long *)local_120._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_120._M_dataplus._M_p + 8))();
        }
      }
      sVar1 = local_148._M_string_length;
      if ((undefined8 *)local_148._M_string_length != (undefined8 *)0x0) {
        if (*(undefined8 **)local_148._M_string_length !=
            (undefined8 *)(local_148._M_string_length + 0x10)) {
          operator_delete(*(undefined8 **)local_148._M_string_length);
        }
        operator_delete((void *)sVar1);
      }
      iVar3 = iVar3 + 1;
    }
    local_120._M_dataplus._M_p = (pointer)local_58;
    testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
              ((internal *)&local_148,"ht.bucket_count()","bucket_count",(unsigned_long *)&local_120
               ,(unsigned_long *)&local_100);
    if ((char)local_148._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_120);
      pcVar2 = "";
      if ((undefined8 *)local_148._M_string_length != (undefined8 *)0x0) {
        pcVar2 = *(char **)local_148._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_150,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x277,pcVar2);
      testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_120);
      testing::internal::AssertHelper::~AssertHelper(&local_150);
      if ((long *)local_120._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_120._M_dataplus._M_p + 8))();
      }
    }
    sVar1 = local_148._M_string_length;
    if ((undefined8 *)local_148._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_148._M_string_length !=
          (undefined8 *)(local_148._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_148._M_string_length);
      }
      operator_delete((void *)sVar1);
    }
    fVar4 = (float)local_58;
    local_f4 = (float)(local_60 - local_68) / fVar4 + -0.01;
    local_f0._44_4_ = 0.5;
    if (local_f4 <= 0.5) {
      local_f0._44_4_ = local_f4;
    }
    local_f0._40_4_ = 1.0;
    local_f0._24_8_ = (long)(fVar4 - 9.223372e+18) & (long)fVar4 >> 0x3f | (long)fVar4;
    local_f0._32_8_ = (undefined8)((float)local_f0._44_4_ * fVar4);
    local_f0._32_8_ =
         (long)((float)local_f0._44_4_ * fVar4 - 9.223372e+18) & (long)local_f0._32_8_ >> 0x3f |
         local_f0._32_8_;
    local_f0[0x30] = false;
    local_120._M_dataplus._M_p = &DAT_3ff0000000000000;
    local_150.data_._0_4_ = 0x3f800000;
    testing::internal::CmpHelperEQ<double,float>
              ((internal *)&local_148,"1.0","ht.max_load_factor()",(double *)&local_120,
               (float *)&local_150);
    if ((char)local_148._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_120);
      pcVar2 = "";
      if ((undefined8 *)local_148._M_string_length != (undefined8 *)0x0) {
        pcVar2 = *(char **)local_148._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_150,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x282,pcVar2);
      testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_120);
      testing::internal::AssertHelper::~AssertHelper(&local_150);
      if ((long *)local_120._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_120._M_dataplus._M_p + 8))();
      }
    }
    sVar1 = local_148._M_string_length;
    if ((undefined8 *)local_148._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_148._M_string_length !=
          (undefined8 *)(local_148._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_148._M_string_length);
      }
      operator_delete((void *)sVar1);
    }
    local_120._M_dataplus._M_p._0_4_ = (float)local_f0._44_4_;
    testing::internal::CmpHelperEQ<float,float>
              ((internal *)&local_148,"shrink_threshold","ht.min_load_factor()",&local_f4,
               (float *)&local_120);
    if ((char)local_148._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_120);
      pcVar2 = "";
      if ((undefined8 *)local_148._M_string_length != (undefined8 *)0x0) {
        pcVar2 = *(char **)local_148._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_150,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x283,pcVar2);
      testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_120);
      testing::internal::AssertHelper::~AssertHelper(&local_150);
      if ((long *)local_120._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_120._M_dataplus._M_p + 8))();
      }
    }
    sVar1 = local_148._M_string_length;
    if ((undefined8 *)local_148._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_148._M_string_length !=
          (undefined8 *)(local_148._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_148._M_string_length);
      }
      operator_delete((void *)sVar1);
    }
    local_100 = local_58;
    iVar3 = 3;
    while( true ) {
      HashtableTest<google::HashtableInterface_DenseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
      ::UniqueKey(&local_148,
                  (HashtableTest<google::HashtableInterface_DenseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                   *)this,iVar3 + -1);
      google::
      dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
      ::erase(this_00,&local_148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_148._M_dataplus._M_p._4_4_,local_148._M_dataplus._M_p._0_4_) !=
          &local_148.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_148._M_dataplus._M_p._4_4_,local_148._M_dataplus._M_p._0_4_))
        ;
      }
      HashtableTest<google::HashtableInterface_DenseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
      ::UniqueKey(&local_148,
                  (HashtableTest<google::HashtableInterface_DenseHashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kEmptyString,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>_>
                   *)this,iVar3);
      google::
      dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
      ::erase(this_00,&local_148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_148._M_dataplus._M_p._4_4_,local_148._M_dataplus._M_p._0_4_) !=
          &local_148.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_148._M_dataplus._M_p._4_4_,local_148._M_dataplus._M_p._0_4_))
        ;
      }
      UniqueObjectHelper<std::__cxx11::string>(&local_120,iVar3);
      google::
      dense_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,Capital,SetKey<std::__cxx11::string,Capital>,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>
      ::insert<std::__cxx11::string_const&>
                ((pair<google::dense_hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>,_bool>
                  *)&local_148,
                 (dense_hashtable<std::__cxx11::string,std::__cxx11::string,Hasher,Capital,SetKey<std::__cxx11::string,Capital>,Hasher,Alloc<std::__cxx11::string,unsigned_long,18446744073709551615ul>>
                  *)this_00,&local_120);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p);
      }
      if ((float)(local_60 - local_68) / (float)local_100 <= local_f4) break;
      local_120._M_dataplus._M_p = (pointer)local_58;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&local_148,"bucket_count","ht.bucket_count()",
                 (unsigned_long *)&local_100,(unsigned_long *)&local_120);
      if ((char)local_148._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_120);
        pcVar2 = "";
        if ((undefined8 *)local_148._M_string_length != (undefined8 *)0x0) {
          pcVar2 = *(char **)local_148._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_150,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                   ,0x28e,pcVar2);
        testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_120);
        testing::internal::AssertHelper::~AssertHelper(&local_150);
        if ((long *)local_120._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_120._M_dataplus._M_p + 8))();
        }
      }
      sVar1 = local_148._M_string_length;
      if ((undefined8 *)local_148._M_string_length != (undefined8 *)0x0) {
        if (*(undefined8 **)local_148._M_string_length !=
            (undefined8 *)(local_148._M_string_length + 0x10)) {
          operator_delete(*(undefined8 **)local_148._M_string_length);
        }
        operator_delete((void *)sVar1);
      }
      iVar3 = iVar3 + 1;
    }
    local_120._M_dataplus._M_p = (pointer)local_58;
    testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
              ((internal *)&local_148,"ht.bucket_count()","bucket_count",(unsigned_long *)&local_120
               ,(unsigned_long *)&local_100);
    if ((char)local_148._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_120);
      pcVar2 = "";
      if ((undefined8 *)local_148._M_string_length != (undefined8 *)0x0) {
        pcVar2 = *(char **)local_148._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_150,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x290,pcVar2);
      testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_120);
      testing::internal::AssertHelper::~AssertHelper(&local_150);
      if ((long *)local_120._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_120._M_dataplus._M_p + 8))();
      }
    }
    sVar1 = local_148._M_string_length;
    if ((undefined8 *)local_148._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_148._M_string_length !=
          (undefined8 *)(local_148._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_148._M_string_length);
      }
      operator_delete((void *)sVar1);
    }
    local_f0._0_8_ = &PTR__BaseHashtableInterface_00c25ac8;
    google::
    dense_hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_Capital,_SetKey<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Capital>,_Hasher,_Alloc<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_18446744073709551615UL>_>
    ::~dense_hashtable(this_00);
    local_124 = local_124 + 0.2;
  } while (local_124 <= 0.8);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, LoadFactor) {
  const typename TypeParam::size_type kSize = 16536;
  // Check growing past various thresholds and then shrinking below
  // them.
  for (float grow_threshold = 0.2f; grow_threshold <= 0.8f;
       grow_threshold += 0.2f) {
    TypeParam ht;
    ht.set_deleted_key(this->UniqueKey(1));
    ht.max_load_factor(grow_threshold);
    ht.min_load_factor(0.0);
    EXPECT_EQ(grow_threshold, ht.max_load_factor());
    EXPECT_EQ(0.0, ht.min_load_factor());

    ht.resize(kSize);
    size_t bucket_count = ht.bucket_count();
    // Erase and insert an element to set consider_shrink = true,
    // which should not cause a shrink because the threshold is 0.0.
    ht.insert(this->UniqueObject(2));
    ht.erase(this->UniqueKey(2));
    for (int i = 2;; ++i) {
      ht.insert(this->UniqueObject(i));
      if (static_cast<float>(ht.size()) / bucket_count < grow_threshold) {
        EXPECT_EQ(bucket_count, ht.bucket_count());
      } else {
        EXPECT_GT(ht.bucket_count(), bucket_count);
        break;
      }
    }
    // Now set a shrink threshold 1% below the current size and remove
    // items until the size falls below that.
    const float shrink_threshold =
        static_cast<float>(ht.size()) / ht.bucket_count() - 0.01f;

    // This time around, check the old set_resizing_parameters interface.
    ht.set_resizing_parameters(shrink_threshold, 1.0);
    EXPECT_EQ(1.0, ht.max_load_factor());
    EXPECT_EQ(shrink_threshold, ht.min_load_factor());

    bucket_count = ht.bucket_count();
    for (int i = 2;; ++i) {
      ht.erase(this->UniqueKey(i));
      // A resize is only triggered by an insert, so add and remove a
      // value every iteration to trigger the shrink as soon as the
      // threshold is passed.
      ht.erase(this->UniqueKey(i + 1));
      ht.insert(this->UniqueObject(i + 1));
      if (static_cast<float>(ht.size()) / bucket_count > shrink_threshold) {
        EXPECT_EQ(bucket_count, ht.bucket_count());
      } else {
        EXPECT_LT(ht.bucket_count(), bucket_count);
        break;
      }
    }
  }
}